

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended-kalman-filter.cpp
# Opt level: O3

MeasureVector __thiscall
stateObservation::ExtendedKalmanFilter::predictSensor_(ExtendedKalmanFilter *this,TimeIndex k)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  void *pvVar5;
  byte bVar6;
  Index index;
  ulong uVar7;
  long in_RDX;
  long lVar8;
  Index extraout_RDX;
  Index size;
  MeasureVector MVar9;
  void *local_40;
  ulong local_38;
  
  if ((*(char *)(k + 0x1a0) != '\x01') || (bVar6 = 1, *(long *)(k + 0x1a8) != in_RDX)) {
    if (*(char *)(k + 0x180) == '\0') goto LAB_0013bfa7;
    (**(code **)(*(long *)k + 0x220))(&local_40,k,k + 400);
    pvVar5 = local_40;
    *(undefined1 *)(k + 0x1a0) = 1;
    *(long *)(k + 0x1a8) = in_RDX;
    if (*(ulong *)(k + 0x1b8) != local_38) {
      if ((long)local_38 < 0) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)(k + 0x1b0),local_38,local_38,1);
      if (*(ulong *)(k + 0x1b8) != local_38) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                     );
      }
    }
    pdVar3 = ((DenseStorage<double,__1,__1,_1,_0> *)(k + 0x1b0))->m_data;
    uVar7 = local_38 - ((long)local_38 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)local_38) {
      lVar8 = 0;
      do {
        pdVar2 = (double *)((long)pvVar5 + lVar8 * 8);
        dVar4 = pdVar2[1];
        pdVar1 = pdVar3 + lVar8;
        *pdVar1 = *pdVar2;
        pdVar1[1] = dVar4;
        lVar8 = lVar8 + 2;
      } while (lVar8 < (long)uVar7);
    }
    if ((long)uVar7 < (long)local_38) {
      do {
        pdVar3[uVar7] = *(double *)((long)pvVar5 + uVar7 * 8);
        uVar7 = uVar7 + 1;
      } while (local_38 != uVar7);
    }
    free(local_40);
    bVar6 = *(byte *)(k + 0x1a0);
  }
  if ((bVar6 & 1) != 0) {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)this,
               (DenseStorage<double,__1,__1,_1,_0> *)(k + 0x1b0));
    MVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    MVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (MeasureVector)
           MVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
LAB_0013bfa7:
  __assert_fail("isSet() && \"Error: Matrix not initialized, if you are initializing it,                             use set() function.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0xd6,
                "bool stateObservation::IndexedMatrixT<Eigen::Matrix<double, -1, 1>>::check_() const [MatrixType = Eigen::Matrix<double, -1, 1>, lazy = false]"
               );
}

Assistant:

ObserverBase::MeasureVector ExtendedKalmanFilter::predictSensor_(TimeIndex k)
{

  if(!this->ybar_.isSet() || this->ybar_.getTime() != k)
  {
    ybar_.set(simulateSensor_(xbar_(), k), k);
  }

  return ybar_();
}